

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

void RccListParseContent(string *content,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *files)

{
  bool bVar1;
  long lVar2;
  value_type local_230;
  undefined1 local_210 [8];
  string tag;
  string qrcEntry;
  char *contentChars;
  undefined1 local_1b8 [8];
  RegularExpression fileReplaceRegex;
  RegularExpression fileMatchRegex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *content_local;
  
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&fileReplaceRegex.progsize,"(<file[^<]+)");
  cmsys::RegularExpression::RegularExpression((RegularExpression *)local_1b8,"(^<file[^>]*>)");
  qrcEntry.field_2._8_8_ = std::__cxx11::string::c_str();
  while( true ) {
    bVar1 = cmsys::RegularExpression::find
                      ((RegularExpression *)&fileReplaceRegex.progsize,
                       (char *)qrcEntry.field_2._8_8_);
    if (!bVar1) break;
    cmsys::RegularExpression::match_abi_cxx11_
              ((string *)((long)&tag.field_2 + 8),(RegularExpression *)&fileReplaceRegex.progsize,1)
    ;
    lVar2 = std::__cxx11::string::size();
    qrcEntry.field_2._8_8_ = qrcEntry.field_2._8_8_ + lVar2;
    cmsys::RegularExpression::find
              ((RegularExpression *)local_1b8,(string *)((long)&tag.field_2 + 8));
    cmsys::RegularExpression::match_abi_cxx11_((string *)local_210,(RegularExpression *)local_1b8,1)
    ;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&local_230,(ulong)((long)&tag.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(files,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)local_210);
    std::__cxx11::string::~string((string *)(tag.field_2._M_local_buf + 8));
  }
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_1b8);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)&fileReplaceRegex.progsize);
  return;
}

Assistant:

static void RccListParseContent(std::string const& content,
                                std::vector<std::string>& files)
{
  cmsys::RegularExpression fileMatchRegex("(<file[^<]+)");
  cmsys::RegularExpression fileReplaceRegex("(^<file[^>]*>)");

  const char* contentChars = content.c_str();
  while (fileMatchRegex.find(contentChars)) {
    std::string const qrcEntry = fileMatchRegex.match(1);
    contentChars += qrcEntry.size();
    {
      fileReplaceRegex.find(qrcEntry);
      std::string const tag = fileReplaceRegex.match(1);
      files.push_back(qrcEntry.substr(tag.size()));
    }
  }
}